

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O3

void __thiscall polyscope::SlicePlane::setSliceGeomUniforms(SlicePlane *this,ShaderProgram *p)

{
  undefined4 uVar1;
  undefined4 uVar2;
  bool bVar3;
  float fVar4;
  float fVar5;
  undefined1 auVar6 [16];
  col_type cVar7;
  undefined1 auVar8 [16];
  undefined1 local_78 [8];
  float fStack_70;
  float fStack_6c;
  undefined1 *local_60 [2];
  undefined1 local_50 [16];
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  if ((this->active).value == true) {
    uVar1 = (this->objectTransform).value.value[0].field_0;
    uVar2 = (this->objectTransform).value.value[0].field_1;
    fVar4 = (this->objectTransform).value.value[0].field_2.z;
    auVar6._0_4_ = (float)uVar1 * (float)uVar1;
    auVar6._4_4_ = (float)uVar2 * (float)uVar2;
    auVar6._8_8_ = 0;
    auVar6 = vhaddps_avx(auVar6,auVar6);
    auVar6 = ZEXT416((uint)(auVar6._0_4_ + fVar4 * fVar4));
    auVar6 = vsqrtss_avx(auVar6,auVar6);
    fVar5 = 1.0 / auVar6._0_4_;
    fVar4 = fVar4 * fVar5;
    local_78._4_4_ = (float)uVar2 * fVar5;
    local_78._0_4_ = (float)uVar1 * fVar5;
    fStack_70 = fVar5 * 0.0;
    fStack_6c = fVar5 * 0.0;
  }
  else {
    _local_78 = SUB6416(ZEXT464(0xbf800000),0);
    fVar4 = 0.0;
  }
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"u_sliceVector","");
  (*p->_vptr_ShaderProgram[9])(local_78,(ulong)(uint)fVar4,p,(string *)local_40);
  if (local_40[0] != local_30) {
    operator_delete(local_40[0]);
  }
  local_60[0] = local_50;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_60,"u_slicePoint","");
  bVar3 = (this->active).value;
  if (bVar3 == false) {
    cVar7 = SUB6416(ZEXT464(0x7f800000),0);
  }
  else {
    cVar7 = (this->objectTransform).value.value[3];
  }
  auVar8._0_4_ = local_78._0_4_ * cVar7.field_0.x;
  auVar8._4_4_ = local_78._4_4_ * cVar7.field_1.y;
  auVar8._8_4_ = local_78._8_4_ * cVar7.field_2.z;
  auVar8._12_4_ = local_78._12_4_ * cVar7.field_3.w;
  auVar6 = vhaddps_avx(auVar8,auVar8);
  (*p->_vptr_ShaderProgram[5])
            ((ulong)(uint)(fVar4 * (uint)(bVar3 & 1) *
                                   (this->objectTransform).value.value[3].field_2 + auVar6._0_4_),p,
             (string *)local_60);
  if (local_60[0] != local_50) {
    operator_delete(local_60[0]);
  }
  return;
}

Assistant:

void SlicePlane::setSliceGeomUniforms(render::ShaderProgram& p) {
  glm::vec3 norm = getNormal();
  p.setUniform("u_sliceVector", norm);
  p.setUniform("u_slicePoint", glm::dot(getCenter(), norm));
}